

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t *
container_not_range(container_t *c,uint8_t type,uint32_t range_start,uint32_t range_end,
                   uint8_t *result_type)

{
  undefined1 uVar1;
  _Bool _Var2;
  int iVar3;
  int in_ECX;
  undefined4 in_EDX;
  undefined1 in_SIL;
  container_t *in_RDI;
  bitset_container_t *in_R8;
  container_t *result;
  undefined4 in_stack_00000018;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar4;
  uint8_t uVar5;
  container_t *local_8;
  
  uVar4 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  container_unwrap_shared(in_RDI,&stack0xffffffffffffffef);
  local_8 = (container_t *)0x0;
  uVar5 = (uint8_t)((uint)uVar4 >> 0x18);
  if (uVar5 == '\x01') {
    _Var2 = bitset_container_negation_range
                      (in_R8,0,0,(container_t **)(ulong)CONCAT14(1,in_stack_ffffffffffffffc8));
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)&in_R8->cardinality = uVar1;
  }
  else if (uVar5 == '\x02') {
    _Var2 = array_container_negation_range
                      ((array_container_t *)CONCAT44(range_end,in_stack_00000018),result_type._4_4_,
                       (int)result_type,(container_t **)result);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)&in_R8->cardinality = uVar1;
  }
  else {
    iVar3 = run_container_negation_range
                      ((run_container_t *)CONCAT44(uVar4,in_EDX),in_ECX,in_stack_ffffffffffffffe0,
                       (container_t **)in_R8);
    *(char *)&in_R8->cardinality = (char)iVar3;
  }
  return local_8;
}

Assistant:

static inline container_t *container_not_range(const container_t *c,
                                               uint8_t type,
                                               uint32_t range_start,
                                               uint32_t range_end,
                                               uint8_t *result_type) {
    c = container_unwrap_shared(c, &type);
    container_t *result = NULL;
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            *result_type =
                bitset_container_negation_range(const_CAST_bitset(c),
                                                range_start, range_end, &result)
                    ? BITSET_CONTAINER_TYPE
                    : ARRAY_CONTAINER_TYPE;
            return result;
        case ARRAY_CONTAINER_TYPE:
            *result_type =
                array_container_negation_range(const_CAST_array(c), range_start,
                                               range_end, &result)
                    ? BITSET_CONTAINER_TYPE
                    : ARRAY_CONTAINER_TYPE;
            return result;
        case RUN_CONTAINER_TYPE:
            *result_type = (uint8_t)run_container_negation_range(
                const_CAST_run(c), range_start, range_end, &result);
            return result;

        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return NULL;
}